

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O0

void av1_tokenize_sb_vartx
               (AV1_COMP *cpi,ThreadData_conflict *td,RUN_TYPE dry_run,BLOCK_SIZE bsize,int *rate,
               uint8_t allow_update_cdf)

{
  byte bVar1;
  byte bVar2;
  int subsampling_y;
  BLOCK_SIZE BVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  BLOCK_SIZE in_CL;
  undefined1 in_DL;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  undefined1 in_R9B;
  int blk_col;
  int blk_row;
  int unit_width;
  int unit_height;
  int idx;
  int idy;
  int mu_blocks_high;
  int mu_blocks_wide;
  BLOCK_SIZE max_unit_bsize;
  int step;
  int block;
  int bh;
  int bw;
  BLOCK_SIZE txb_size;
  TX_SIZE max_tx_size;
  int mi_height;
  int mi_width;
  BLOCK_SIZE plane_bsize;
  int ss_y;
  int ss_x;
  macroblockd_plane *pd;
  int plane;
  tokenize_b_args arg;
  MB_MODE_INFO *mbmi;
  int num_planes;
  int mi_col;
  int mi_row;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  AV1_COMMON *cm;
  undefined1 *in_stack_ffffffffffffff10;
  MACROBLOCKD *in_stack_ffffffffffffff18;
  uint local_dc;
  int in_stack_ffffffffffffff28;
  uint uVar11;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int iVar12;
  int local_c8;
  int local_bc;
  int local_b8;
  int local_74;
  long lVar13;
  int iVar14;
  undefined2 in_stack_ffffffffffffffa6;
  int in_stack_ffffffffffffffb0;
  int iVar15;
  int iVar16;
  
  BVar3 = (BLOCK_SIZE)((uint)in_stack_ffffffffffffff2c >> 0x18);
  iVar16 = *(int *)(in_RSI + 0x1a0);
  iVar15 = *(int *)(in_RSI + 0x1a4);
  if ((iVar16 < *(int *)(in_RDI + 0x3c194)) && (iVar15 < *(int *)(in_RDI + 0x3c198))) {
    iVar4 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
    iVar14 = 0;
    if (*(char *)(**(long **)(in_RSI + 0x2058) + 0x90) == '\0') {
      local_74 = 0;
      lVar13 = in_RSI;
      while ((local_74 < iVar4 && ((local_74 == 0 || ((*(byte *)(in_RSI + 0x1ac) & 1) != 0))))) {
        lVar10 = in_RSI + 0x1b0 + (long)local_74 * 0xa30;
        iVar12 = *(int *)(lVar10 + 4);
        subsampling_y = *(int *)(lVar10 + 8);
        BVar3 = get_plane_block_size(in_CL,iVar12,subsampling_y);
        uVar5 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [BVar3];
        uVar6 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                      [BVar3];
        iVar7 = get_vartx_max_txsize
                          (in_stack_ffffffffffffff18,
                           (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff10 >> 0x38),
                           (int)in_stack_ffffffffffffff10);
        bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [txsize_to_bsize[(byte)iVar7]];
        bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                [txsize_to_bsize[(byte)iVar7]];
        BVar3 = get_plane_block_size(BLOCK_64X64,iVar12,subsampling_y);
        uVar8 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [BVar3];
        uVar9 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                      [BVar3];
        if (uVar5 < uVar8) {
          uVar8 = uVar5;
        }
        if (uVar6 < uVar9) {
          uVar9 = uVar6;
        }
        for (local_b8 = 0; local_b8 < (int)uVar6; local_b8 = uVar9 + local_b8) {
          for (local_bc = 0; local_bc < (int)uVar5; local_bc = uVar8 + local_bc) {
            uVar11 = uVar6;
            if ((int)(uVar9 + local_b8) < (int)uVar6) {
              uVar11 = uVar9 + local_b8;
            }
            local_dc = uVar5;
            if ((int)(uVar8 + local_bc) < (int)uVar5) {
              local_dc = uVar8 + local_bc;
            }
            for (local_c8 = local_b8; iVar12 = local_bc, local_c8 < (int)uVar11;
                local_c8 = (uint)bVar2 + local_c8) {
              for (; iVar12 < (int)local_dc; iVar12 = (uint)bVar1 + iVar12) {
                in_stack_ffffffffffffff10 = &stack0xffffffffffffff90;
                tokenize_vartx((ThreadData_conflict *)
                               CONCAT26(in_stack_ffffffffffffffa6,
                                        CONCAT15(in_DL,CONCAT14(in_R9B,iVar14))),
                               (TX_SIZE)((ulong)lVar13 >> 0x38),(BLOCK_SIZE)((ulong)lVar13 >> 0x30),
                               (int)lVar13,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                               in_stack_ffffffffffffffb0,(void *)CONCAT44(iVar16,iVar15));
              }
            }
          }
        }
        local_74 = local_74 + 1;
      }
      if (in_R8 != (int *)0x0) {
        *in_R8 = iVar14 + *in_R8;
      }
    }
    else {
      av1_reset_entropy_context
                ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),BVar3,
                 in_stack_ffffffffffffff28);
    }
  }
  return;
}

Assistant:

void av1_tokenize_sb_vartx(const AV1_COMP *cpi, ThreadData *td,
                           RUN_TYPE dry_run, BLOCK_SIZE bsize, int *rate,
                           uint8_t allow_update_cdf) {
  assert(bsize < BLOCK_SIZES_ALL);
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  if (mi_row >= cm->mi_params.mi_rows || mi_col >= cm->mi_params.mi_cols)
    return;

  const int num_planes = av1_num_planes(cm);
  MB_MODE_INFO *const mbmi = xd->mi[0];
  struct tokenize_b_args arg = { cpi, td, 0, allow_update_cdf, dry_run };

  if (mbmi->skip_txfm) {
    av1_reset_entropy_context(xd, bsize, num_planes);
    return;
  }

  for (int plane = 0; plane < num_planes; ++plane) {
    if (plane && !xd->is_chroma_ref) break;
    const struct macroblockd_plane *const pd = &xd->plane[plane];
    const int ss_x = pd->subsampling_x;
    const int ss_y = pd->subsampling_y;
    const BLOCK_SIZE plane_bsize = get_plane_block_size(bsize, ss_x, ss_y);
    assert(plane_bsize < BLOCK_SIZES_ALL);
    const int mi_width = mi_size_wide[plane_bsize];
    const int mi_height = mi_size_high[plane_bsize];
    const TX_SIZE max_tx_size = get_vartx_max_txsize(xd, plane_bsize, plane);
    const BLOCK_SIZE txb_size = txsize_to_bsize[max_tx_size];
    const int bw = mi_size_wide[txb_size];
    const int bh = mi_size_high[txb_size];
    int block = 0;
    const int step =
        tx_size_wide_unit[max_tx_size] * tx_size_high_unit[max_tx_size];

    const BLOCK_SIZE max_unit_bsize =
        get_plane_block_size(BLOCK_64X64, ss_x, ss_y);
    int mu_blocks_wide = mi_size_wide[max_unit_bsize];
    int mu_blocks_high = mi_size_high[max_unit_bsize];

    mu_blocks_wide = AOMMIN(mi_width, mu_blocks_wide);
    mu_blocks_high = AOMMIN(mi_height, mu_blocks_high);

    for (int idy = 0; idy < mi_height; idy += mu_blocks_high) {
      for (int idx = 0; idx < mi_width; idx += mu_blocks_wide) {
        const int unit_height = AOMMIN(mu_blocks_high + idy, mi_height);
        const int unit_width = AOMMIN(mu_blocks_wide + idx, mi_width);
        for (int blk_row = idy; blk_row < unit_height; blk_row += bh) {
          for (int blk_col = idx; blk_col < unit_width; blk_col += bw) {
            tokenize_vartx(td, max_tx_size, plane_bsize, blk_row, blk_col,
                           block, plane, &arg);
            block += step;
          }
        }
      }
    }
  }
  if (rate) *rate += arg.this_rate;
}